

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O2

void __thiscall
QTextDocumentLayoutPrivate::layoutFlow
          (QTextDocumentLayoutPrivate *this,Iterator it,QTextLayoutStruct *layoutStruct,
          int layoutFrom,int layoutTo,QFixed width)

{
  QFixedPoint *this_00;
  QList<QCheckPoint> *pQVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  QFixed QVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  QTextDocumentLayoutPrivate *object;
  QObject *object_00;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  QTextFormat QVar19;
  QTextFrame *pQVar20;
  bool bVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  Position PVar25;
  PageBreakFlags PVar26;
  QFixed QVar27;
  QFlagsStorage<Qt::AlignmentFlag> QVar28;
  QFixed QVar29;
  int iVar30;
  int iVar31;
  QDebug *pQVar32;
  QTextFrameData *pQVar33;
  QTextFrame *pQVar34;
  iterator iVar35;
  iterator iVar36;
  iterator iVar37;
  QTextFrameData *pQVar38;
  QTextTable *pQVar39;
  QFixedPoint QVar40;
  QTextFrameData *pQVar41;
  QFixedPoint QVar42;
  QTextLayout *pQVar43;
  QTextOption *pQVar44;
  int iVar45;
  uint uVar46;
  int i;
  ulong uVar47;
  QTextBlockFormat *previousBlockFormat;
  ulong uVar48;
  QTextDocumentLayoutPrivate *this_01;
  QTextDocumentLayoutPrivate *this_02;
  long in_FS_OFFSET;
  qreal qVar49;
  QTextLine QVar50;
  QPointF QVar51;
  QSizeF QVar52;
  QTextFormat QVar53;
  double local_158;
  int layoutFrom_local;
  undefined1 local_e8 [8];
  qreal qStack_e0;
  undefined1 local_d8 [24];
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined1 local_b8 [8];
  QTextEngine *pQStack_b0;
  QSizeF local_a8;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  iterator local_78;
  undefined1 local_58 [4];
  QFixed QStack_54;
  int iStack_50;
  QFixed QStack_4c;
  QFixed QStack_48;
  QFixed QStack_44;
  int iStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  layoutFrom_local = layoutFrom;
  QtPrivateLogging::lcLayout();
  if (((byte)QtPrivateLogging::lcLayout::category.field_2.bools.enabledDebug._q_value._M_base._M_i &
      1) != 0) {
    local_58 = (undefined1  [4])0x2;
    QStack_54.val = 0;
    iStack_50 = 0;
    QStack_4c.val = 0;
    QStack_48.val = 0;
    QStack_44.val = 0;
    iStack_40 = (int)QtPrivateLogging::lcLayout::category.name;
    uStack_3c = (undefined4)((ulong)QtPrivateLogging::lcLayout::category.name >> 0x20);
    QMessageLogger::debug();
    pQVar32 = QDebug::operator<<((QDebug *)&local_78,"layoutFlow from=");
    pQVar32 = QDebug::operator<<(pQVar32,layoutFrom_local);
    pQVar32 = QDebug::operator<<(pQVar32,"to=");
    QDebug::operator<<(pQVar32,layoutTo);
    QDebug::~QDebug((QDebug *)&local_78);
  }
  pQVar33 = ::data(layoutStruct->frame);
  pQVar20 = it.f;
  pQVar33->currentLayoutStruct = layoutStruct;
  local_78._28_4_ = 0xaaaaaaaa;
  local_78.f = (QTextFrame *)0x0;
  local_78.b = 0;
  local_78.e = 0;
  local_78.cf._0_4_ = 0;
  local_78.cf._4_4_ = 0;
  local_78.cb = 0;
  pQVar34 = QTextDocument::rootFrame((this->super_QAbstractTextDocumentLayoutPrivate).document);
  if (pQVar20 == pQVar34) {
    if ((layoutStruct->fullLayout == false) && ((this->checkPoints).d.size != 0)) {
      pQVar1 = &this->checkPoints;
      iVar35 = QList<QCheckPoint>::begin(pQVar1);
      iVar36 = QList<QCheckPoint>::end(pQVar1);
      iVar35 = std::__lower_bound<QList<QCheckPoint>::iterator,int,__gnu_cxx::__ops::_Iter_less_val>
                         (iVar35.i,iVar36.i,&layoutFrom_local);
      iVar36 = QList<QCheckPoint>::end(pQVar1);
      if (iVar35.i != iVar36.i) {
        iVar37 = QList<QCheckPoint>::begin(pQVar1);
        iVar36.i = iVar35.i + -1;
        if (iVar35.i == iVar37.i) {
          iVar36 = iVar35;
        }
        (layoutStruct->y).val = ((iVar36.i)->y).val;
        (layoutStruct->frameY).val = ((iVar36.i)->frameY).val;
        (layoutStruct->minimumWidth).val = ((iVar36.i)->minimumWidth).val;
        (layoutStruct->maximumWidth).val = ((iVar36.i)->maximumWidth).val;
        (layoutStruct->contentsWidth).val = ((iVar36.i)->contentsWidth).val;
        if (0 < (layoutStruct->pageHeight).val) {
          iVar22 = QTextLayoutStruct::currentPage(layoutStruct);
          (layoutStruct->pageBottom).val =
               (iVar22 + 1) * (layoutStruct->pageHeight).val - (layoutStruct->pageBottomMargin).val;
        }
        frameIteratorForTextPosition((Iterator *)local_58,this,(iVar36.i)->positionInFrame);
        it.f = (QTextFrame *)CONCAT44(QStack_54.val,local_58);
        it.cf._0_4_ = QStack_48.val;
        it.cf._4_4_ = QStack_44.val;
        it.cb = iStack_40;
        it.b = iStack_50;
        it.e = QStack_4c.val;
        iVar35 = QList<QCheckPoint>::begin(pQVar1);
        QList<QCheckPoint>::resize(pQVar1,((long)iVar36.i - (long)iVar35.i) / 0x18 + 1);
        iVar35 = QList<QCheckPoint>::begin(pQVar1);
        if (iVar36.i != iVar35.i) {
          local_78.cf._0_4_ = (int)it.cf;
          local_78.cf._4_4_ = it.cf._4_4_;
          local_78.cb = it.cb;
          local_78.f = it.f;
          local_78.b = it.b;
          local_78.e = it.e;
          QTextFrame::iterator::operator--(&local_78);
        }
        goto LAB_0047488a;
      }
    }
    QList<QCheckPoint>::clear(&this->checkPoints);
    uVar2 = layoutStruct->frameY;
    uVar4 = layoutStruct->y;
    iStack_50 = 0;
    uVar11 = layoutStruct->minimumWidth;
    uVar14 = layoutStruct->maximumWidth;
    QStack_44.val = (layoutStruct->contentsWidth).val;
    local_58 = (undefined1  [4])uVar4;
    QStack_54.val = uVar2;
    QStack_4c.val = uVar11;
    QStack_48.val = uVar14;
    QList<QCheckPoint>::emplaceBack<QCheckPoint_const&>(&this->checkPoints,(QCheckPoint *)local_58);
  }
LAB_0047488a:
  local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextFrame::iterator::currentBlock(&local_78);
  QTextBlock::blockFormat((QTextBlock *)local_88);
  pQVar1 = &this->checkPoints;
  iVar22 = 0;
  while( true ) {
    this_02 = (QTextDocumentLayoutPrivate *)local_98;
    object = (QTextDocumentLayoutPrivate *)CONCAT44(it.cf._4_4_,(int)it.cf);
    if (((object == (QTextDocumentLayoutPrivate *)0x0) && (it.cb == it.e)) ||
       (0x1fffffbf < (layoutStruct->frameY).val + (layoutStruct->y).val)) break;
    if (object == (QTextDocumentLayoutPrivate *)0x0) {
      this_01 = (QTextDocumentLayoutPrivate *)local_58;
      QTextFrame::iterator::currentBlock(&it);
      iVar23 = QTextBlock::position((QTextBlock *)this_01);
    }
    else {
      this_01 = object;
      iVar23 = QTextFrame::firstPosition((QTextFrame *)object);
    }
    QVar53 = (QTextFormat)local_d8._0_16_;
    if (pQVar20 == pQVar34) {
      QVar27.val = (layoutStruct->y).val;
      uVar46 = QVar27.val - (this->checkPoints).d.ptr[(this->checkPoints).d.size + -1].y.val;
      uVar24 = -uVar46;
      if (0 < (int)uVar46) {
        uVar24 = uVar46;
      }
      if (0x1f400 < uVar24) {
        auVar17._12_4_ = 0;
        auVar17._0_12_ = stack0xffffffffffffff4c;
        _local_b8 = (QTextFormat)(auVar17 << 0x20);
        local_d8._0_8_ = local_d8._0_8_ & 0xffffffff00000000;
        floatMargins(this_01,QVar27,layoutStruct,(QFixed *)local_b8,(QFixed *)local_d8);
        QVar19._8_8_ = local_d8._8_8_;
        QVar19.d.d.ptr =
             (totally_ordered_wrapper<QTextFormatPrivate_*>)
             (totally_ordered_wrapper<QTextFormatPrivate_*>)local_d8._0_8_;
        QVar53._8_8_ = local_d8._8_8_;
        QVar53.d.d.ptr =
             (totally_ordered_wrapper<QTextFormatPrivate_*>)
             (totally_ordered_wrapper<QTextFormatPrivate_*>)local_d8._0_8_;
        if ((local_b8._0_4_ == (layoutStruct->x_left).val) &&
           (QVar53 = QVar19, local_d8._0_4_ == (layoutStruct->x_right).val)) {
          uVar3 = layoutStruct->frameY;
          uVar5 = layoutStruct->y;
          uVar12 = layoutStruct->minimumWidth;
          uVar15 = layoutStruct->maximumWidth;
          QStack_44.val = (layoutStruct->contentsWidth).val;
          local_58 = (undefined1  [4])uVar5;
          QStack_54.val = uVar3;
          iStack_50 = iVar23;
          QStack_4c.val = uVar12;
          QStack_48.val = uVar15;
          QList<QCheckPoint>::emplaceBack<QCheckPoint_const&>(pQVar1,(QCheckPoint *)local_58);
          QVar53 = (QTextFormat)local_d8._0_16_;
          if ((this->currentLazyLayoutPosition != -1) &&
             (this->currentLazyLayoutPosition + this->lazyLayoutStepSize < iVar23)) break;
        }
      }
    }
    if (object == (QTextDocumentLayoutPrivate *)0x0) {
      uStack_3c = 0xaaaaaaaa;
      local_58 = (undefined1  [4])0x0;
      QStack_54.val = 0;
      iStack_50 = 0;
      QStack_4c.val = 0;
      QStack_48.val = 0;
      QStack_44.val = 0;
      iStack_40 = 0;
      if (((CONCAT44(local_78.cf._4_4_,(int)local_78.cf) != 0) || (local_78.cb != local_78.e)) &&
         ((local_78.f != it.f ||
          ((CONCAT44(local_78.cf._4_4_,(int)local_78.cf) != CONCAT44(it.cf._4_4_,(int)it.cf) ||
           (local_78.cb != it.cb)))))) {
        QStack_48.val = (int)local_78.cf;
        QStack_44.val = local_78.cf._4_4_;
        iStack_40 = local_78.cb;
        local_58 = SUB84(local_78.f,0);
        QStack_54.val = (int)((ulong)local_78.f >> 0x20);
        iStack_50 = local_78.b;
        QStack_4c.val = local_78.e;
      }
      local_78.cf._0_4_ = (int)it.cf;
      local_78.cf._4_4_ = it.cf._4_4_;
      local_78.cb = it.cb;
      local_78.f = it.f;
      local_78.b = it.b;
      local_78.e = it.e;
      local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_d8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextFrame::iterator::currentBlock(&it);
      QTextFrame::iterator::operator++(&it);
      local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextBlock::blockFormat((QTextBlock *)this_02);
      PVar26 = QTextBlockFormat::pageBreakPolicy((QTextBlockFormat *)this_02);
      if (((uint)PVar26.super_QFlagsStorageHelper<QTextFormat::PageBreakFlag,_4>.
                 super_QFlagsStorage<QTextFormat::PageBreakFlag>.i & 1) != 0) {
        QTextLayoutStruct::newPage(layoutStruct);
      }
      iVar45 = (layoutStruct->pageBottom).val;
      iVar7 = (layoutStruct->y).val;
      iVar8 = (layoutStruct->maximumWidth).val;
      (layoutStruct->maximumWidth).val = 0;
      QTextFrame::iterator::currentBlock((iterator *)local_58);
      bVar21 = QTextBlock::isValid((QTextBlock *)local_b8);
      previousBlockFormat = (QTextBlockFormat *)0x0;
      if (bVar21) {
        previousBlockFormat = (QTextBlockFormat *)local_88;
      }
      layoutBlock(this,(QTextBlock *)local_d8,iVar23,(QTextBlockFormat *)local_98,layoutStruct,
                  layoutFrom_local,layoutTo,previousBlockFormat);
      if (pQVar20 == pQVar34) {
        pQVar43 = QTextBlock::layout((QTextBlock *)local_d8);
        pQVar44 = QTextLayout::textOption(pQVar43);
        if ((undefined1  [24])((undefined1  [24])*pQVar44 & (undefined1  [24])0x1) ==
            (undefined1  [24])0x0) {
          this->contentHasAlignment = true;
        }
      }
      bVar21 = isEmptyBlockBeforeTable((QTextBlock *)local_d8,(QTextBlockFormat *)local_98,&it);
      if (bVar21) {
        pQStack_b0 = (QTextEngine *)&DAT_aaaaaaaaaaaaaaaa;
        local_b8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
        QTextFrame::iterator::currentBlock((iterator *)local_58);
        bVar21 = QTextBlock::isValid((QTextBlock *)local_b8);
        local_158 = 0.0;
        if (bVar21) {
          QTextBlock::blockFormat((QTextBlock *)local_e8);
          local_158 = QTextBlockFormat::bottomMargin((QTextBlockFormat *)local_e8);
          QTextFormat::~QTextFormat((QTextFormat *)local_e8);
        }
        QTextBlock::blockFormat((QTextBlock *)local_e8);
        qVar49 = QTextBlockFormat::topMargin((QTextBlockFormat *)local_e8);
        if (qVar49 <= local_158) {
          qVar49 = local_158;
        }
        (layoutStruct->y).val = iVar7 + (int)(qVar49 * 64.0);
        QTextFormat::~QTextFormat((QTextFormat *)local_e8);
        (layoutStruct->pageBottom).val = iVar45;
      }
      else {
        bVar21 = isEmptyBlockAfterTable
                           ((QTextBlock *)local_d8,
                            (QTextFrame *)CONCAT44(QStack_44.val,QStack_48.val));
        if (bVar21) {
          pQVar38 = ::data((QTextFrame *)CONCAT44(QStack_44.val,QStack_48.val));
          pQVar43 = QTextBlock::layout((QTextBlock *)local_d8);
          local_e8 = (undefined1  [8])0xffffffffffffffff;
          qStack_e0 = -NAN;
          iVar30 = (pQVar38->position).x.val;
          iVar31 = (pQVar38->position).y.val;
          iVar9 = (pQVar38->size).width.val;
          iVar10 = (pQVar38->size).height.val;
          QTextLayout::boundingRect((QRectF *)local_b8,pQVar43);
          qStack_e0 = (double)(iVar31 + iVar10) * 0.015625 - local_a8.ht;
          local_e8 = (undefined1  [8])((double)(iVar30 + iVar9) * 0.015625);
          QTextLayout::setPosition(pQVar43,(QPointF *)local_e8);
          (layoutStruct->y).val = iVar7;
          (layoutStruct->pageBottom).val = iVar45;
        }
        object_00 = (QObject *)CONCAT44(QStack_44.val,QStack_48.val);
        pQVar39 = QtPrivate::qobject_cast_helper<QTextTable_const*,QObject_const>(object_00);
        if (((pQVar39 != (QTextTable *)0x0) &&
            (bVar21 = QTextBlock::isValid((QTextBlock *)local_d8), bVar21)) &&
           (iVar30 = QTextBlock::length((QTextBlock *)local_d8), 1 < iVar30)) {
          QTextBlock::text((QString *)local_b8,(QTextBlock *)local_d8);
          if (*(char16_t *)&(pQStack_b0->lines).d.d == L'\x2028') {
            iVar30 = QTextFrame::lastPosition((QTextFrame *)object_00);
            iVar31 = QTextBlock::position((QTextBlock *)local_d8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_b8)
            ;
            if (iVar30 == iVar31 + -1) {
              pQVar38 = ::data((QTextFrame *)CONCAT44(QStack_44.val,QStack_48.val));
              pQVar43 = QTextBlock::layout((QTextBlock *)local_d8);
              iVar30 = QTextLayout::lineCount(pQVar43);
              if (iVar30 < 1) {
                iVar30 = 0;
              }
              else {
                QVar50 = QTextLayout::lineAt(pQVar43,0);
                local_b8._0_4_ = QVar50.index;
                pQStack_b0 = QVar50.eng;
                qVar49 = QTextLine::height((QTextLine *)local_b8);
                iVar30 = (int)(qVar49 * 64.0);
              }
              if ((layoutStruct->pageBottom).val == iVar45) {
                (layoutStruct->y).val = (layoutStruct->y).val - iVar30;
                QVar51 = QTextLayout::position(pQVar43);
                pQStack_b0 = (QTextEngine *)((double)iVar30 * -0.015625 + QVar51.yp);
                local_b8 = (undefined1  [8])QVar51.xp;
                QTextLayout::setPosition(pQVar43,(QPointF *)local_b8);
              }
              else {
                (layoutStruct->y).val = iVar7 - iVar30;
                (layoutStruct->pageBottom).val = iVar45;
                layoutBlock(this,(QTextBlock *)local_d8,iVar23,(QTextBlockFormat *)local_98,
                            layoutStruct,layoutFrom_local,layoutTo,previousBlockFormat);
              }
              iVar23 = QTextLayout::lineCount(pQVar43);
              if (0 < iVar23) {
                iVar23 = (pQVar38->size).height.val;
                QVar40 = pQVar38->position;
                iVar45 = (pQVar38->size).width.val;
                QVar50 = QTextLayout::lineAt(pQVar43,0);
                local_b8._0_4_ = QVar50.index;
                pQStack_b0 = QVar50.eng;
                QVar51 = QTextLayout::position(pQVar43);
                local_e8 = (undefined1  [8])
                           ((double)(iVar45 + QVar40.x.val.val) * 0.015625 - QVar51.xp);
                qStack_e0 = (double)((iVar23 - iVar30) + QVar40.y.val.val) * 0.015625 - QVar51.yp;
                QTextLine::setPosition((QTextLine *)local_b8,(QPointF *)local_e8);
              }
            }
          }
          else {
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_b8)
            ;
          }
        }
        PVar26 = QTextBlockFormat::pageBreakPolicy((QTextBlockFormat *)local_98);
        if (((uint)PVar26.super_QFlagsStorageHelper<QTextFormat::PageBreakFlag,_4>.
                   super_QFlagsStorage<QTextFormat::PageBreakFlag>.i & 0x10) != 0) {
          QTextLayoutStruct::newPage(layoutStruct);
        }
      }
      iVar23 = (layoutStruct->maximumWidth).val;
      if (iVar22 <= iVar23) {
        iVar22 = iVar23;
      }
      (layoutStruct->maximumWidth).val = iVar8;
      QTextFormat::operator=((QTextFormat *)local_88,(QTextFormat *)local_98);
    }
    else {
      local_d8._0_16_ = (undefined1  [16])QVar53;
      pQVar38 = ::data((QTextFrame *)object);
      local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextFrame::frameFormat((QTextFrame *)this_02);
      PVar25 = QTextFrameFormat::position((QTextFrameFormat *)this_02);
      if (PVar25 == InFlow) {
        PVar26 = QTextFrameFormat::pageBreakPolicy((QTextFrameFormat *)this_02);
        if (((uint)PVar26.super_QFlagsStorageHelper<QTextFormat::PageBreakFlag,_4>.
                   super_QFlagsStorage<QTextFormat::PageBreakFlag>.i & 1) != 0) {
          this_02 = (QTextDocumentLayoutPrivate *)layoutStruct;
          QTextLayoutStruct::newPage(layoutStruct);
        }
        auVar18._12_4_ = 0;
        auVar18._0_12_ = stack0xffffffffffffff4c;
        _local_b8 = (QTextFormat)(auVar18 << 0x20);
        local_d8._0_8_ = local_d8._0_8_ & 0xffffffff00000000;
        floatMargins(this_02,(QFixed)(layoutStruct->y).val,layoutStruct,(QFixed *)local_b8,
                     (QFixed *)local_d8);
        QVar27.val = (layoutStruct->x_left).val;
        if (QVar27.val < (int)local_b8._0_4_) {
          QVar27.val = local_b8._0_4_;
        }
        local_b8._0_4_ = QVar27.val;
        iVar23 = (layoutStruct->x_right).val;
        if ((int)local_d8._0_4_ < iVar23) {
          iVar23 = local_d8._0_4_;
        }
        local_d8._0_4_ = iVar23;
        QVar6.val = (pQVar38->size).width.val;
        if (iVar23 - QVar27.val < QVar6.val) {
          QVar27 = findY(this_02,(layoutStruct->y).val,layoutStruct,QVar6);
          (layoutStruct->y).val = QVar27.val;
          floatMargins(this_02,QVar27,layoutStruct,(QFixed *)local_b8,(QFixed *)local_d8);
          QVar27.val = local_b8._0_4_;
        }
        uVar47 = (ulong)(uint)QVar27.val;
        QVar6.val = (layoutStruct->y).val;
        uVar48 = (ulong)(uint)QVar6.val;
        pQVar39 = QtPrivate::qobject_cast_helper<QTextTable*,QObject>((QObject *)object);
        QVar28.i = 0;
        if (pQVar39 != (QTextTable *)0x0) {
          QTextTable::format((QTextTable *)local_58);
          QVar28.i = (Int)QTextTableFormat::alignment((QTextTableFormat *)local_58);
          QTextFormat::~QTextFormat((QTextFormat *)local_58);
          if ((QVar28.i & 1) == 0 && pQVar20 == pQVar34) {
            this->contentHasAlignment = true;
          }
        }
        QVar40.y.val = QVar6.val;
        QVar40.x.val = QVar27.val;
        pQVar38->position = QVar40;
        QVar52 = QTextDocument::pageSize((this->super_QAbstractTextDocumentLayoutPrivate).document);
        if (QVar52.ht <= 0.0) {
          if ((pQVar38->sizeDirty & 1U) != 0) goto LAB_00474e34;
        }
        else {
          pQVar38->sizeDirty = true;
LAB_00474e34:
          QVar29.val = (layoutStruct->frameY).val;
          if (width.val == 0) {
            layoutFrame((QRectF *)local_58,this,(QTextFrame *)object,layoutFrom_local,layoutTo,
                        QVar29);
          }
          else {
            layoutFrame((QRectF *)local_58,this,(QTextFrame *)object,layoutFrom_local,layoutTo,width
                        ,(QFixed)0xffffffc0,QVar29);
          }
          if (pQVar39 == (QTextTable *)0x0) {
            QTextFrame::begin((iterator *)local_58,(QTextFrame *)object);
            QVar29 = flowPosition((iterator *)local_58);
          }
          else {
            pQVar41 = ::data(&pQVar39->super_QTextFrame);
            QVar29.val = **(int **)&pQVar41[2].topMargin;
          }
          if ((layoutStruct->pageBottom).val < QVar29.val + QVar6.val + (layoutStruct->frameY).val)
          {
            QTextLayoutStruct::newPage(layoutStruct);
            QVar6.val = (layoutStruct->y).val;
            uVar48 = (ulong)(uint)QVar6.val;
            QVar42.y.val = QVar6.val;
            QVar42.x.val = QVar27.val;
            pQVar38->position = QVar42;
            pQVar38->sizeDirty = true;
            QVar6.val = (layoutStruct->frameY).val;
            if (width.val == 0) {
              layoutFrame((QRectF *)local_58,this,(QTextFrame *)object,layoutFrom_local,layoutTo,
                          QVar6);
            }
            else {
              layoutFrame((QRectF *)local_58,this,(QTextFrame *)object,layoutFrom_local,layoutTo,
                          width,(QFixed)0xffffffc0,QVar6);
            }
          }
        }
        iVar23 = (pQVar38->size).width.val;
        if (iVar23 < local_d8._0_4_ - QVar27.val) {
          if ((QVar28.i & 2) == 0) {
            if ((QVar28.i & 4) != 0) {
              uVar47 = (ulong)(uint)(QVar27.val + ((layoutStruct->x_right).val - iVar23) / 2);
            }
          }
          else {
            uVar47 = (ulong)(uint)((QVar27.val - iVar23) + (layoutStruct->x_right).val);
          }
        }
        pQVar38->position = (QFixedPoint)(uVar47 | uVar48 << 0x20);
        (layoutStruct->y).val = (layoutStruct->y).val + (pQVar38->size).height.val;
        iVar23 = QTextLayoutStruct::currentPage(layoutStruct);
        (layoutStruct->pageBottom).val =
             (iVar23 + 1) * (layoutStruct->pageHeight).val - (layoutStruct->pageBottomMargin).val;
        pQVar38->layoutDirty = false;
        QTextFrame::frameFormat((QTextFrame *)local_58);
        PVar26 = QTextFrameFormat::pageBreakPolicy((QTextFrameFormat *)local_58);
        QTextFormat::~QTextFormat((QTextFormat *)local_58);
        if (((uint)PVar26.super_QFlagsStorageHelper<QTextFormat::PageBreakFlag,_4>.
                   super_QFlagsStorage<QTextFormat::PageBreakFlag>.i & 0x10) != 0) {
          QTextLayoutStruct::newPage(layoutStruct);
        }
      }
      else {
        this_00 = &pQVar38->position;
        QStack_48.val = -1;
        QStack_44.val = -1;
        iStack_40 = -1;
        uStack_3c = 0xffffffff;
        local_58 = (undefined1  [4])0xffffffff;
        QStack_54.val = -1;
        iStack_50 = -1;
        QStack_4c.val = -1;
        QVar51 = QFixedPoint::toPointF(this_00);
        QVar52 = QFixedSize::toSizeF(&pQVar38->size);
        local_58 = QVar51.xp._0_4_;
        QStack_54.val = QVar51.xp._4_4_;
        iStack_50 = QVar51.yp._0_4_;
        QStack_4c.val = QVar51.yp._4_4_;
        QStack_48.val = QVar52.wd._0_4_;
        QStack_44.val = QVar52.wd._4_4_;
        iStack_40 = QVar52.ht._0_4_;
        uStack_3c = QVar52.ht._4_4_;
        local_a8.wd = 0.0;
        local_a8.ht = 0.0;
        local_b8 = (undefined1  [8])0x0;
        pQStack_b0 = (QTextEngine *)0x0;
        QVar53 = (QTextFormat)ZEXT816(0);
        if (pQVar38->sizeDirty == true) {
          layoutFrame((QRectF *)local_d8,this,(QTextFrame *)object,layoutFrom_local,layoutTo,
                      (QFixed)0x0);
          local_a8 = stack0xffffffffffffff38;
          QVar53 = (QTextFormat)local_d8._0_16_;
        }
        _local_b8 = QVar53;
        positionFloat(this,(QTextFrame *)object,(QTextLine *)0x0);
        if (pQVar38->sizeDirty == true) {
          layoutFrame((QRectF *)local_d8,this,(QTextFrame *)object,layoutFrom_local,layoutTo,
                      (QFixed)0x0);
          local_a8 = stack0xffffffffffffff38;
          _local_b8 = (QTextFormat)local_d8._0_16_;
        }
        uStack_c0 = 0xffffffff;
        local_d8._16_8_ = 0xffffffffffffffff;
        uStack_bc = 0xffffffff;
        local_d8._0_8_ = (QTextDocumentPrivate *)0xffffffffffffffff;
        local_d8._8_8_ = -NAN;
        QVar53 = (QTextFormat)QFixedPoint::toPointF(this_00);
        join_0x00001240_0x00001200_ = QFixedSize::toSizeF(&pQVar38->size);
        local_d8._0_16_ = (undefined1  [16])QVar53;
        bVar21 = ::comparesEqual((QRectF *)local_d8,(QRectF *)local_58);
        if (((!bVar21) || (local_a8.wd <= 0.0)) || (local_a8.ht <= 0.0)) {
          local_a8 = stack0xffffffffffffff38;
          local_b8 = (undefined1  [8])local_d8._0_8_;
          pQStack_b0._0_4_ = local_d8._8_4_;
          pQStack_b0._4_4_ = local_d8._12_4_;
        }
        else {
          QVar51 = QFixedPoint::toPointF(this_00);
          pQStack_b0 = (QTextEngine *)(QVar51.yp + (double)pQStack_b0);
          local_b8 = (undefined1  [8])(QVar51.xp + (double)local_b8);
        }
        QTextLayoutStruct::addUpdateRectForFloat(layoutStruct,(QRectF *)local_b8);
        if ((0.0 < (double)CONCAT44(QStack_44.val,QStack_48.val)) &&
           (0.0 < (double)CONCAT44(uStack_3c,iStack_40))) {
          QTextLayoutStruct::addUpdateRectForFloat(layoutStruct,(QRectF *)local_58);
        }
      }
      iVar23 = (pQVar38->minimumWidth).val;
      iVar45 = (layoutStruct->minimumWidth).val;
      iVar7 = (layoutStruct->maximumWidth).val;
      if (iVar23 < iVar45) {
        iVar23 = iVar45;
      }
      (layoutStruct->minimumWidth).val = iVar23;
      iVar23 = (pQVar38->maximumWidth).val;
      if (iVar7 < iVar23) {
        iVar23 = iVar7;
      }
      (layoutStruct->maximumWidth).val = iVar23;
      local_78.cf._0_4_ = (int)it.cf;
      local_78.cf._4_4_ = it.cf._4_4_;
      local_78.cb = it.cb;
      local_78.f = it.f;
      local_78.b = it.b;
      local_78.e = it.e;
      QTextFrame::iterator::operator++(&it);
    }
    QTextFormat::~QTextFormat((QTextFormat *)local_98);
  }
  iVar23 = (layoutStruct->maximumWidth).val;
  iVar45 = iVar22;
  if (iVar22 < iVar23) {
    iVar45 = iVar23;
  }
  if (iVar22 < 1) {
    iVar22 = iVar45;
  }
  if (iVar23 != 0x1fffffc0) {
    iVar22 = iVar45;
  }
  (layoutStruct->maximumWidth).val = iVar22;
  pQVar39 = QtPrivate::qobject_cast_helper<QTextTable*,QObject>((QObject *)layoutStruct->frame);
  if (pQVar39 == (QTextTable *)0x0) {
    QStack_48.val = -0x55555556;
    QStack_44.val = -0x55555556;
    local_58 = (undefined1  [4])0xaaaaaaaa;
    QStack_54.val = -0x55555556;
    iStack_50 = -0x55555556;
    QStack_4c.val = -0x55555556;
    QTextFrame::childFrames((QList<QTextFrame_*> *)local_58,layoutStruct->frame);
    for (uVar47 = 0; uVar47 < CONCAT44(QStack_44.val,QStack_48.val); uVar47 = uVar47 + 1) {
      pQVar38 = ::data(*(QTextFrame **)(CONCAT44(QStack_4c.val,iStack_50) + uVar47 * 8));
      if (pQVar38->layoutDirty == false) {
        QTextFrame::frameFormat((QTextFrame *)local_b8);
        PVar25 = QTextFrameFormat::position((QTextFrameFormat *)local_b8);
        QTextFormat::~QTextFormat((QTextFormat *)local_b8);
        if (PVar25 != InFlow) {
          iVar23 = (pQVar38->position).y.val + (pQVar38->size).height.val;
          iVar22 = (layoutStruct->y).val;
          if (iVar23 < iVar22) {
            iVar23 = iVar22;
          }
          (layoutStruct->y).val = iVar23;
        }
      }
    }
    QArrayDataPointer<QTextFrame_*>::~QArrayDataPointer((QArrayDataPointer<QTextFrame_*> *)local_58)
    ;
  }
  if (pQVar20 == pQVar34) {
    if ((pQVar33->floats).d.size != 0) {
      this->contentHasAlignment = true;
    }
    if (((CONCAT44(it.cf._4_4_,(int)it.cf) == 0) && (it.cb == it.e)) ||
       (0x1fffffbf < (layoutStruct->frameY).val + (layoutStruct->y).val)) {
      this->currentLazyLayoutPosition = -1;
      QStack_54.val = 0;
      local_58 = (undefined1  [4])(layoutStruct->y).val;
      iStack_50 = QTextDocumentPrivate::length
                            ((this->super_QAbstractTextDocumentLayoutPrivate).docPrivate);
      uVar13 = layoutStruct->minimumWidth;
      uVar16 = layoutStruct->maximumWidth;
      QStack_44.val = (layoutStruct->contentsWidth).val;
      QStack_4c.val = uVar13;
      QStack_48.val = uVar16;
      QList<QCheckPoint>::emplaceBack<QCheckPoint_const&>(pQVar1,(QCheckPoint *)local_58);
      QList<QCheckPoint>::reserve(pQVar1,(this->checkPoints).d.size);
    }
    else {
      this->currentLazyLayoutPosition =
           (this->checkPoints).d.ptr[(this->checkPoints).d.size + -1].positionInFrame;
    }
  }
  pQVar33->currentLayoutStruct = (QTextLayoutStruct *)0x0;
  QTextFormat::~QTextFormat((QTextFormat *)local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentLayoutPrivate::layoutFlow(QTextFrame::Iterator it, QTextLayoutStruct *layoutStruct,
                                            int layoutFrom, int layoutTo, QFixed width)
{
    qCDebug(lcLayout) << "layoutFlow from=" << layoutFrom << "to=" << layoutTo;
    QTextFrameData *fd = data(layoutStruct->frame);

    fd->currentLayoutStruct = layoutStruct;

    QTextFrame::Iterator previousIt;

    const bool inRootFrame = (it.parentFrame() == document->rootFrame());
    if (inRootFrame) {
        bool redoCheckPoints = layoutStruct->fullLayout || checkPoints.isEmpty();

        if (!redoCheckPoints) {
            auto checkPoint = std::lower_bound(checkPoints.begin(), checkPoints.end(), layoutFrom);
            if (checkPoint != checkPoints.end()) {
                if (checkPoint != checkPoints.begin())
                    --checkPoint;

                layoutStruct->y = checkPoint->y;
                layoutStruct->frameY = checkPoint->frameY;
                layoutStruct->minimumWidth = checkPoint->minimumWidth;
                layoutStruct->maximumWidth = checkPoint->maximumWidth;
                layoutStruct->contentsWidth = checkPoint->contentsWidth;

                if (layoutStruct->pageHeight > 0) {
                    int page = layoutStruct->currentPage();
                    layoutStruct->pageBottom = (page + 1) * layoutStruct->pageHeight - layoutStruct->pageBottomMargin;
                }

                it = frameIteratorForTextPosition(checkPoint->positionInFrame);
                checkPoints.resize(checkPoint - checkPoints.begin() + 1);

                if (checkPoint != checkPoints.begin()) {
                    previousIt = it;
                    --previousIt;
                }
            } else {
                redoCheckPoints = true;
            }
        }

        if (redoCheckPoints) {
            checkPoints.clear();
            QCheckPoint cp;
            cp.y = layoutStruct->y;
            cp.frameY = layoutStruct->frameY;
            cp.positionInFrame = 0;
            cp.minimumWidth = layoutStruct->minimumWidth;
            cp.maximumWidth = layoutStruct->maximumWidth;
            cp.contentsWidth = layoutStruct->contentsWidth;
            checkPoints.append(cp);
        }
    }

    QTextBlockFormat previousBlockFormat = previousIt.currentBlock().blockFormat();

    QFixed maximumBlockWidth = 0;
    while (!it.atEnd() && layoutStruct->absoluteY() < QFIXED_MAX) {
        QTextFrame *c = it.currentFrame();

        int docPos;
        if (it.currentFrame())
            docPos = it.currentFrame()->firstPosition();
        else
            docPos = it.currentBlock().position();

        if (inRootFrame) {
            if (qAbs(layoutStruct->y - checkPoints.constLast().y) > 2000) {
                QFixed left, right;
                floatMargins(layoutStruct->y, layoutStruct, &left, &right);
                if (left == layoutStruct->x_left && right == layoutStruct->x_right) {
                    QCheckPoint p;
                    p.y = layoutStruct->y;
                    p.frameY = layoutStruct->frameY;
                    p.positionInFrame = docPos;
                    p.minimumWidth = layoutStruct->minimumWidth;
                    p.maximumWidth = layoutStruct->maximumWidth;
                    p.contentsWidth = layoutStruct->contentsWidth;
                    checkPoints.append(p);

                    if (currentLazyLayoutPosition != -1
                        && docPos > currentLazyLayoutPosition + lazyLayoutStepSize)
                        break;

                }
            }
        }

        if (c) {
            // position child frame
            QTextFrameData *cd = data(c);

            QTextFrameFormat fformat = c->frameFormat();

            if (fformat.position() == QTextFrameFormat::InFlow) {
                if (fformat.pageBreakPolicy() & QTextFormat::PageBreak_AlwaysBefore)
                    layoutStruct->newPage();

                QFixed left, right;
                floatMargins(layoutStruct->y, layoutStruct, &left, &right);
                left = qMax(left, layoutStruct->x_left);
                right = qMin(right, layoutStruct->x_right);

                if (right - left < cd->size.width) {
                    layoutStruct->y = findY(layoutStruct->y, layoutStruct, cd->size.width);
                    floatMargins(layoutStruct->y, layoutStruct, &left, &right);
                }

                QFixedPoint pos(left, layoutStruct->y);

                Qt::Alignment align = Qt::AlignLeft;

                QTextTable *table = qobject_cast<QTextTable *>(c);

                if (table)
                    align = table->format().alignment() & Qt::AlignHorizontal_Mask;

                // detect whether we have any alignment in the document that disallows optimizations,
                // such as not laying out the document again in a textedit with wrapping disabled.
                if (inRootFrame && !(align & Qt::AlignLeft))
                    contentHasAlignment = true;

                cd->position = pos;

                if (document->pageSize().height() > 0.0f)
                    cd->sizeDirty = true;

                if (cd->sizeDirty) {
                    if (width != 0)
                        layoutFrame(c, layoutFrom, layoutTo, width, -1, layoutStruct->frameY);
                    else
                        layoutFrame(c, layoutFrom, layoutTo, layoutStruct->frameY);

                    QFixed absoluteChildPos = table ? pos.y + static_cast<QTextTableData *>(data(table))->rowPositions.at(0) : pos.y + firstChildPos(c);
                    absoluteChildPos += layoutStruct->frameY;

                    // drop entire frame to next page if first child of frame is on next page
                    if (absoluteChildPos > layoutStruct->pageBottom) {
                        layoutStruct->newPage();
                        pos.y = layoutStruct->y;

                        cd->position = pos;
                        cd->sizeDirty = true;

                        if (width != 0)
                            layoutFrame(c, layoutFrom, layoutTo, width, -1, layoutStruct->frameY);
                        else
                            layoutFrame(c, layoutFrom, layoutTo, layoutStruct->frameY);
                    }
                }

                // align only if there is space for alignment
                if (right - left > cd->size.width) {
                    if (align & Qt::AlignRight)
                        pos.x += layoutStruct->x_right - cd->size.width;
                    else if (align & Qt::AlignHCenter)
                        pos.x += (layoutStruct->x_right - cd->size.width) / 2;
                }

                cd->position = pos;

                layoutStruct->y += cd->size.height;
                const int page = layoutStruct->currentPage();
                layoutStruct->pageBottom = (page + 1) * layoutStruct->pageHeight - layoutStruct->pageBottomMargin;

                cd->layoutDirty = false;

                if (c->frameFormat().pageBreakPolicy() & QTextFormat::PageBreak_AlwaysAfter)
                    layoutStruct->newPage();
            } else {
                QRectF oldFrameRect(cd->position.toPointF(), cd->size.toSizeF());
                QRectF updateRect;

                if (cd->sizeDirty)
                    updateRect = layoutFrame(c, layoutFrom, layoutTo);

                positionFloat(c);

                // If the size was made dirty when the position was set, layout again
                if (cd->sizeDirty)
                    updateRect = layoutFrame(c, layoutFrom, layoutTo);

                QRectF frameRect(cd->position.toPointF(), cd->size.toSizeF());

                if (frameRect == oldFrameRect && updateRect.isValid())
                    updateRect.translate(cd->position.toPointF());
                else
                    updateRect = frameRect;

                layoutStruct->addUpdateRectForFloat(updateRect);
                if (oldFrameRect.isValid())
                    layoutStruct->addUpdateRectForFloat(oldFrameRect);
            }

            layoutStruct->minimumWidth = qMax(layoutStruct->minimumWidth, cd->minimumWidth);
            layoutStruct->maximumWidth = qMin(layoutStruct->maximumWidth, cd->maximumWidth);

            previousIt = it;
            ++it;
        } else {
            QTextFrame::Iterator lastIt;
            if (!previousIt.atEnd() && previousIt != it)
                lastIt = previousIt;
            previousIt = it;
            QTextBlock block = it.currentBlock();
            ++it;

            const QTextBlockFormat blockFormat = block.blockFormat();

            if (blockFormat.pageBreakPolicy() & QTextFormat::PageBreak_AlwaysBefore)
                layoutStruct->newPage();

            const QFixed origY = layoutStruct->y;
            const QFixed origPageBottom = layoutStruct->pageBottom;
            const QFixed origMaximumWidth = layoutStruct->maximumWidth;
            layoutStruct->maximumWidth = 0;

            const QTextBlockFormat *previousBlockFormatPtr = nullptr;
            if (lastIt.currentBlock().isValid())
                previousBlockFormatPtr = &previousBlockFormat;

            // layout and position child block
            layoutBlock(block, docPos, blockFormat, layoutStruct, layoutFrom, layoutTo, previousBlockFormatPtr);

            // detect whether we have any alignment in the document that disallows optimizations,
            // such as not laying out the document again in a textedit with wrapping disabled.
            if (inRootFrame && !(block.layout()->textOption().alignment() & Qt::AlignLeft))
                contentHasAlignment = true;

            // if the block right before a table is empty 'hide' it by
            // positioning it into the table border
            if (isEmptyBlockBeforeTable(block, blockFormat, it)) {
                const QTextBlock lastBlock = lastIt.currentBlock();
                const qreal lastBlockBottomMargin = lastBlock.isValid() ? lastBlock.blockFormat().bottomMargin() : 0.0f;
                layoutStruct->y = origY + QFixed::fromReal(qMax(lastBlockBottomMargin, block.blockFormat().topMargin()));
                layoutStruct->pageBottom = origPageBottom;
            } else {
                // if the block right after a table is empty then 'hide' it, too
                if (isEmptyBlockAfterTable(block, lastIt.currentFrame())) {
                    QTextTableData *td = static_cast<QTextTableData *>(data(lastIt.currentFrame()));
                    QTextLayout *layout = block.layout();

                    QPointF pos((td->position.x + td->size.width).toReal(),
                                (td->position.y + td->size.height).toReal() - layout->boundingRect().height());

                    layout->setPosition(pos);
                    layoutStruct->y = origY;
                    layoutStruct->pageBottom = origPageBottom;
                }

                // if the block right after a table starts with a line separator, shift it up by one line
                if (isLineSeparatorBlockAfterTable(block, lastIt.currentFrame())) {
                    QTextTableData *td = static_cast<QTextTableData *>(data(lastIt.currentFrame()));
                    QTextLayout *layout = block.layout();

                    QFixed height = layout->lineCount() > 0 ? QFixed::fromReal(layout->lineAt(0).height()) : QFixed();

                    if (layoutStruct->pageBottom == origPageBottom) {
                        layoutStruct->y -= height;
                        layout->setPosition(layout->position() - QPointF(0, height.toReal()));
                    } else {
                        // relayout block to correctly handle page breaks
                        layoutStruct->y = origY - height;
                        layoutStruct->pageBottom = origPageBottom;
                        layoutBlock(block, docPos, blockFormat, layoutStruct, layoutFrom, layoutTo, previousBlockFormatPtr);
                    }

                    if (layout->lineCount() > 0) {
                        QPointF linePos((td->position.x + td->size.width).toReal(),
                                        (td->position.y + td->size.height - height).toReal());

                        layout->lineAt(0).setPosition(linePos - layout->position());
                    }
                }

                if (blockFormat.pageBreakPolicy() & QTextFormat::PageBreak_AlwaysAfter)
                    layoutStruct->newPage();
            }

            maximumBlockWidth = qMax(maximumBlockWidth, layoutStruct->maximumWidth);
            layoutStruct->maximumWidth = origMaximumWidth;
            previousBlockFormat = blockFormat;
        }
    }
    if (layoutStruct->maximumWidth == QFIXED_MAX && maximumBlockWidth > 0)
        layoutStruct->maximumWidth = maximumBlockWidth;
    else
        layoutStruct->maximumWidth = qMax(layoutStruct->maximumWidth, maximumBlockWidth);

    // a float at the bottom of a frame may make it taller, hence the qMax() for layoutStruct->y.
    // we don't need to do it for tables though because floats in tables are per table
    // and not per cell and layoutCell already takes care of doing the same as we do here
    if (!qobject_cast<QTextTable *>(layoutStruct->frame)) {
        QList<QTextFrame *> children = layoutStruct->frame->childFrames();
        for (int i = 0; i < children.size(); ++i) {
            QTextFrameData *fd = data(children.at(i));
            if (!fd->layoutDirty && children.at(i)->frameFormat().position() != QTextFrameFormat::InFlow)
                layoutStruct->y = qMax(layoutStruct->y, fd->position.y + fd->size.height);
        }
    }

    if (inRootFrame) {
        // we assume that any float is aligned in a way that disallows the optimizations that rely
        // on unaligned content.
        if (!fd->floats.isEmpty())
            contentHasAlignment = true;

        if (it.atEnd() || layoutStruct->absoluteY() >= QFIXED_MAX) {
            //qDebug("layout done!");
            currentLazyLayoutPosition = -1;
            QCheckPoint cp;
            cp.y = layoutStruct->y;
            cp.positionInFrame = docPrivate->length();
            cp.minimumWidth = layoutStruct->minimumWidth;
            cp.maximumWidth = layoutStruct->maximumWidth;
            cp.contentsWidth = layoutStruct->contentsWidth;
            checkPoints.append(cp);
            checkPoints.reserve(checkPoints.size());
        } else {
            currentLazyLayoutPosition = checkPoints.constLast().positionInFrame;
            // #######
            //checkPoints.last().positionInFrame = QTextDocumentPrivate::get(q->document())->length();
        }
    }


    fd->currentLayoutStruct = nullptr;
}